

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qclipboard.cpp
# Opt level: O0

void QClipboard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QtMocHelpers *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QClipboard *_t;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      changed((QClipboard *)0x33f6c3,Clipboard);
      break;
    case 1:
      selectionChanged((QClipboard *)0x33f6cf);
      break;
    case 2:
      findBufferChanged((QClipboard *)0x33f6db);
      break;
    case 3:
      dataChanged((QClipboard *)0x33f6e7);
    }
  }
  if ((((in_ESI == 5) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QClipboard::*)(QClipboard::Mode)>
                          (in_RCX,(void **)changed,0,0), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QClipboard::*)()>
                         (in_RCX,(void **)selectionChanged,0,1), !bVar1)) &&
     (bVar1 = QtMocHelpers::indexOfMethod<void(QClipboard::*)()>
                        (in_RCX,(void **)findBufferChanged,0,2), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QClipboard::*)()>(in_RCX,(void **)dataChanged,0,3);
  }
  return;
}

Assistant:

void QClipboard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QClipboard *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->changed((*reinterpret_cast< std::add_pointer_t<QClipboard::Mode>>(_a[1]))); break;
        case 1: _t->selectionChanged(); break;
        case 2: _t->findBufferChanged(); break;
        case 3: _t->dataChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)(QClipboard::Mode )>(_a, &QClipboard::changed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::selectionChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::findBufferChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QClipboard::*)()>(_a, &QClipboard::dataChanged, 3))
            return;
    }
}